

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3PcacheDrop(PgHdr *p)

{
  PgHdr *in_RDI;
  
  if ((in_RDI->flags & 2) != 0) {
    pcacheManageDirtyList(in_RDI,'\x01');
  }
  in_RDI->pCache->nRefSum = in_RDI->pCache->nRefSum + -1;
  (*sqlite3Config.pcache2.xUnpin)(in_RDI->pCache->pCache,in_RDI->pPage,1);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3PcacheDrop(PgHdr *p){
  assert( p->nRef==1 );
  assert( sqlite3PcachePageSanity(p) );
  if( p->flags&PGHDR_DIRTY ){
    pcacheManageDirtyList(p, PCACHE_DIRTYLIST_REMOVE);
  }
  p->pCache->nRefSum--;
  sqlite3GlobalConfig.pcache2.xUnpin(p->pCache->pCache, p->pPage, 1);
}